

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O2

bool __thiscall gimage::JPEGImageIO::handlesFile(JPEGImageIO *this,char *name,bool reading)

{
  long lVar1;
  bool bVar2;
  allocator local_29;
  string s;
  
  std::__cxx11::string::string((string *)&s,name,&local_29);
  if (s._M_string_length < 5) {
    bVar2 = false;
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char *)&s,0x149fe9);
    bVar2 = true;
    if (lVar1 != s._M_string_length - 4) {
      lVar1 = std::__cxx11::string::rfind((char *)&s,0x149fee);
      bVar2 = lVar1 == s._M_string_length - 4;
    }
  }
  std::__cxx11::string::~string((string *)&s);
  return bVar2;
}

Assistant:

bool JPEGImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;

  if (s.size() <= 4)
  {
    return false;
  }

  if (s.rfind(".jpg") == s.size()-4 || s.rfind(".JPG") == s.size()-4)
  {
    return true;
  }

  return false;
}